

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O1

void __thiscall
rangeless::mt::
synchronized_queue<rangeless::fn::impl::maybe<long>,_rangeless::mt::lockables::atomic_mutex>::
synchronized_queue(synchronized_queue<rangeless::fn::impl::maybe<long>,_rangeless::mt::lockables::atomic_mutex>
                   *this,size_t cap)

{
  (this->push).m_queue = this;
  (this->pop).m_queue = this;
  this->m_padding0[0] = '\0';
  this->m_padding0[1] = '\0';
  this->m_padding0[2] = '\0';
  this->m_padding0[3] = '\0';
  this->m_padding0[4] = '\0';
  this->m_padding0[5] = '\0';
  this->m_padding0[6] = '\0';
  this->m_padding0[7] = '\0';
  this->m_padding0[8] = '\0';
  this->m_padding0[9] = '\0';
  this->m_padding0[10] = '\0';
  this->m_padding0[0xb] = '\0';
  this->m_padding0[0xc] = '\0';
  this->m_padding0[0xd] = '\0';
  this->m_padding0[0xe] = '\0';
  this->m_padding0[0xf] = '\0';
  this->m_padding0[0x10] = '\0';
  this->m_padding0[0x11] = '\0';
  this->m_padding0[0x12] = '\0';
  this->m_padding0[0x13] = '\0';
  this->m_padding0[0x14] = '\0';
  this->m_padding0[0x15] = '\0';
  this->m_padding0[0x16] = '\0';
  this->m_padding0[0x17] = '\0';
  this->m_padding0[0x18] = '\0';
  this->m_padding0[0x19] = '\0';
  this->m_padding0[0x1a] = '\0';
  this->m_padding0[0x1b] = '\0';
  this->m_padding0[0x1c] = '\0';
  this->m_padding0[0x1d] = '\0';
  this->m_padding0[0x1e] = '\0';
  this->m_padding0[0x1f] = '\0';
  this->m_padding0[0x20] = '\0';
  this->m_padding0[0x21] = '\0';
  this->m_padding0[0x22] = '\0';
  this->m_padding0[0x23] = '\0';
  this->m_padding0[0x24] = '\0';
  this->m_padding0[0x25] = '\0';
  this->m_padding0[0x26] = '\0';
  this->m_padding0[0x27] = '\0';
  this->m_padding0[0x28] = '\0';
  this->m_padding0[0x29] = '\0';
  this->m_padding0[0x2a] = '\0';
  this->m_padding0[0x2b] = '\0';
  this->m_padding0[0x2c] = '\0';
  this->m_padding0[0x2d] = '\0';
  this->m_padding0[0x2e] = '\0';
  this->m_padding0[0x2f] = '\0';
  this->m_padding0[0x30] = '\0';
  this->m_padding0[0x31] = '\0';
  this->m_padding0[0x32] = '\0';
  this->m_padding0[0x33] = '\0';
  this->m_padding0[0x34] = '\0';
  this->m_padding0[0x35] = '\0';
  this->m_padding0[0x36] = '\0';
  this->m_padding0[0x37] = '\0';
  this->m_padding0[0x38] = '\0';
  this->m_padding0[0x39] = '\0';
  this->m_padding0[0x3a] = '\0';
  this->m_padding0[0x3b] = '\0';
  this->m_padding0[0x3c] = '\0';
  this->m_padding0[0x3d] = '\0';
  this->m_padding0[0x3e] = '\0';
  this->m_padding0[0x3f] = '\0';
  this->m_num_waiting_to_push = 0;
  this->m_num_waiting_to_pop = 0;
  this->m_capacity = cap;
  (this->m_queue).c.
  super__Deque_base<rangeless::fn::impl::maybe<long>,_std::allocator<rangeless::fn::impl::maybe<long>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_queue).c.
  super__Deque_base<rangeless::fn::impl::maybe<long>,_std::allocator<rangeless::fn::impl::maybe<long>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->m_queue).c.
  super__Deque_base<rangeless::fn::impl::maybe<long>,_std::allocator<rangeless::fn::impl::maybe<long>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_queue).c.
  super__Deque_base<rangeless::fn::impl::maybe<long>,_std::allocator<rangeless::fn::impl::maybe<long>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_queue).c.
  super__Deque_base<rangeless::fn::impl::maybe<long>,_std::allocator<rangeless::fn::impl::maybe<long>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_queue).c.
  super__Deque_base<rangeless::fn::impl::maybe<long>,_std::allocator<rangeless::fn::impl::maybe<long>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_queue).c.
  super__Deque_base<rangeless::fn::impl::maybe<long>,_std::allocator<rangeless::fn::impl::maybe<long>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_queue).c.
  super__Deque_base<rangeless::fn::impl::maybe<long>,_std::allocator<rangeless::fn::impl::maybe<long>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_queue).c.
  super__Deque_base<rangeless::fn::impl::maybe<long>,_std::allocator<rangeless::fn::impl::maybe<long>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_queue).c.
  super__Deque_base<rangeless::fn::impl::maybe<long>,_std::allocator<rangeless::fn::impl::maybe<long>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<rangeless::fn::impl::maybe<long>,_std::allocator<rangeless::fn::impl::maybe<long>_>_>
  ::_M_initialize_map((_Deque_base<rangeless::fn::impl::maybe<long>,_std::allocator<rangeless::fn::impl::maybe<long>_>_>
                       *)&this->m_queue,0);
  this->m_queue_mutex = (atomic<bool>)0x0;
  this->m_push_mutex = (atomic<bool>)0x0;
  (this->m_pop_mutex).m_locked._M_base._M_i = false;
  std::_V2::condition_variable_any::condition_variable_any(&this->m_can_push);
  std::_V2::condition_variable_any::condition_variable_any(&this->m_can_pop);
  this->m_padding1[0x30] = '\0';
  this->m_padding1[0x31] = '\0';
  this->m_padding1[0x32] = '\0';
  this->m_padding1[0x33] = '\0';
  this->m_padding1[0x34] = '\0';
  this->m_padding1[0x35] = '\0';
  this->m_padding1[0x36] = '\0';
  this->m_padding1[0x37] = '\0';
  this->m_padding1[0x38] = '\0';
  this->m_padding1[0x39] = '\0';
  this->m_padding1[0x3a] = '\0';
  this->m_padding1[0x3b] = '\0';
  this->m_padding1[0x3c] = '\0';
  this->m_padding1[0x3d] = '\0';
  this->m_padding1[0x3e] = '\0';
  this->m_padding1[0x3f] = '\0';
  this->m_padding1[0x20] = '\0';
  this->m_padding1[0x21] = '\0';
  this->m_padding1[0x22] = '\0';
  this->m_padding1[0x23] = '\0';
  this->m_padding1[0x24] = '\0';
  this->m_padding1[0x25] = '\0';
  this->m_padding1[0x26] = '\0';
  this->m_padding1[0x27] = '\0';
  this->m_padding1[0x28] = '\0';
  this->m_padding1[0x29] = '\0';
  this->m_padding1[0x2a] = '\0';
  this->m_padding1[0x2b] = '\0';
  this->m_padding1[0x2c] = '\0';
  this->m_padding1[0x2d] = '\0';
  this->m_padding1[0x2e] = '\0';
  this->m_padding1[0x2f] = '\0';
  this->m_padding1[0x10] = '\0';
  this->m_padding1[0x11] = '\0';
  this->m_padding1[0x12] = '\0';
  this->m_padding1[0x13] = '\0';
  this->m_padding1[0x14] = '\0';
  this->m_padding1[0x15] = '\0';
  this->m_padding1[0x16] = '\0';
  this->m_padding1[0x17] = '\0';
  this->m_padding1[0x18] = '\0';
  this->m_padding1[0x19] = '\0';
  this->m_padding1[0x1a] = '\0';
  this->m_padding1[0x1b] = '\0';
  this->m_padding1[0x1c] = '\0';
  this->m_padding1[0x1d] = '\0';
  this->m_padding1[0x1e] = '\0';
  this->m_padding1[0x1f] = '\0';
  this->m_padding1[0] = '\0';
  this->m_padding1[1] = '\0';
  this->m_padding1[2] = '\0';
  this->m_padding1[3] = '\0';
  this->m_padding1[4] = '\0';
  this->m_padding1[5] = '\0';
  this->m_padding1[6] = '\0';
  this->m_padding1[7] = '\0';
  this->m_padding1[8] = '\0';
  this->m_padding1[9] = '\0';
  this->m_padding1[10] = '\0';
  this->m_padding1[0xb] = '\0';
  this->m_padding1[0xc] = '\0';
  this->m_padding1[0xd] = '\0';
  this->m_padding1[0xe] = '\0';
  this->m_padding1[0xf] = '\0';
  return;
}

Assistant:

synchronized_queue(size_t cap = 1024)
      : m_capacity{ cap }
    {}